

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

obx_qb_cond __thiscall
obx::anon_unknown_3::QCGroup::applyTo(QCGroup *this,OBX_query_builder *cqb,bool isRoot)

{
  bool bVar1;
  size_type sVar2;
  __shared_ptr_access<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar3;
  int *piVar4;
  obx_qb_cond local_74;
  __shared_ptr_access<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_70;
  shared_ptr<obx::(anonymous_namespace)::QueryCondition> *cond;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  *__range2;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> cond_ids;
  bool isRoot_local;
  OBX_query_builder *cqb_local;
  QCGroup *this_local;
  
  cond_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = isRoot;
  sVar2 = std::
          vector<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
          ::size(&this->conditions_);
  if (sVar2 == 1) {
    this_00 = (__shared_ptr_access<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                 ::operator[](&this->conditions_,0);
    peVar3 = std::
             __shared_ptr_access<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*(this_00);
    this_local._4_4_ =
         internalApplyCondition
                   (peVar3,cqb,
                    (bool)(cond_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
  }
  else {
    bVar1 = std::
            vector<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
            ::empty(&this->conditions_);
    if (bVar1) {
      internal::throwIllegalStateException("State condition failed: ","!conditions_.empty()");
    }
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
    sVar2 = std::
            vector<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
            ::size(&this->conditions_);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)local_40,sVar2);
    __end2 = std::
             vector<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
             ::begin(&this->conditions_);
    cond = (shared_ptr<obx::(anonymous_namespace)::QueryCondition> *)
           std::
           vector<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
           ::end(&this->conditions_);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_*,_std::vector<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>_>
                                  *)&cond);
      if (!bVar1) break;
      local_70 = (__shared_ptr_access<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)__gnu_cxx::
                    __normal_iterator<const_std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_*,_std::vector<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>_>
                    ::operator*(&__end2);
      peVar3 = std::
               __shared_ptr_access<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(local_70);
      local_74 = internalApplyCondition(peVar3,cqb,false);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)local_40,&local_74);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_*,_std::vector<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>_>
      ::operator++(&__end2);
    }
    if (((cond_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._7_1_ & 1) == 0) || ((this->isOr_ & 1U) != 0)) {
      if ((this->isOr_ & 1U) == 0) {
        piVar4 = std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)local_40);
        sVar2 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_40);
        this_local._4_4_ = obx_qb_all(cqb,piVar4,sVar2);
      }
      else {
        piVar4 = std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)local_40);
        sVar2 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_40);
        this_local._4_4_ = obx_qb_any(cqb,piVar4,sVar2);
      }
    }
    else {
      this_local._4_4_ = 0;
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

obx_qb_cond applyTo(OBX_query_builder* cqb, bool isRoot) const override {
        if (conditions_.size() == 1) return internalApplyCondition(*conditions_[0], cqb, isRoot);
        OBX_VERIFY_STATE(!conditions_.empty());

        std::vector<obx_qb_cond> cond_ids;
        cond_ids.reserve(conditions_.size());
        for (const std::shared_ptr<QueryCondition>& cond : conditions_) {
            cond_ids.emplace_back(internalApplyCondition(*cond, cqb, false));
        }
        if (isRoot && !isOr_) {
            // root All (AND) is implicit so no need to actually combine the conditions explicitly
            return 0;
        }

        if (isOr_) return obx_qb_any(cqb, cond_ids.data(), cond_ids.size());
        return obx_qb_all(cqb, cond_ids.data(), cond_ids.size());
    }